

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Fixed ft_var_apply_tuple(GX_Blend blend,FT_UShort tupleIndex,FT_Fixed *tuple_coords,
                           FT_Fixed *im_start_coords,FT_Fixed *im_end_coords)

{
  long local_60;
  long local_50;
  FT_Long local_40;
  FT_Fixed apply;
  FT_UInt i;
  FT_Fixed *im_end_coords_local;
  FT_Fixed *im_start_coords_local;
  FT_Fixed *tuple_coords_local;
  FT_UShort tupleIndex_local;
  GX_Blend blend_local;
  
  local_40 = 0x10000;
  apply._4_4_ = 0;
  do {
    if (blend->num_axis <= apply._4_4_) {
      return local_40;
    }
    if (tuple_coords[apply._4_4_] != 0) {
      if (blend->normalizedcoords[apply._4_4_] == 0) {
        return 0;
      }
      if (blend->normalizedcoords[apply._4_4_] != tuple_coords[apply._4_4_]) {
        if ((tupleIndex & 0x4000) == 0) {
          if (tuple_coords[apply._4_4_] < 1) {
            local_50 = tuple_coords[apply._4_4_];
          }
          else {
            local_50 = 0;
          }
          if (blend->normalizedcoords[apply._4_4_] < local_50) {
            return 0;
          }
          if (tuple_coords[apply._4_4_] < 0) {
            local_60 = 0;
          }
          else {
            local_60 = tuple_coords[apply._4_4_];
          }
          if (local_60 < blend->normalizedcoords[apply._4_4_]) {
            return 0;
          }
          local_40 = FT_MulDiv(local_40,blend->normalizedcoords[apply._4_4_],
                               tuple_coords[apply._4_4_]);
        }
        else {
          if ((blend->normalizedcoords[apply._4_4_] < im_start_coords[apply._4_4_]) ||
             (im_end_coords[apply._4_4_] < blend->normalizedcoords[apply._4_4_])) {
            return 0;
          }
          if (blend->normalizedcoords[apply._4_4_] < tuple_coords[apply._4_4_]) {
            local_40 = FT_MulDiv(local_40,blend->normalizedcoords[apply._4_4_] -
                                          im_start_coords[apply._4_4_],
                                 tuple_coords[apply._4_4_] - im_start_coords[apply._4_4_]);
          }
          else {
            local_40 = FT_MulDiv(local_40,im_end_coords[apply._4_4_] -
                                          blend->normalizedcoords[apply._4_4_],
                                 im_end_coords[apply._4_4_] - tuple_coords[apply._4_4_]);
          }
        }
      }
    }
    apply._4_4_ = apply._4_4_ + 1;
  } while( true );
}

Assistant:

static FT_Fixed
  ft_var_apply_tuple( GX_Blend   blend,
                      FT_UShort  tupleIndex,
                      FT_Fixed*  tuple_coords,
                      FT_Fixed*  im_start_coords,
                      FT_Fixed*  im_end_coords )
  {
    FT_UInt   i;
    FT_Fixed  apply = 0x10000L;


    for ( i = 0; i < blend->num_axis; i++ )
    {
      FT_TRACE6(( "    axis coordinate %d (%.5f):\n",
                  i, blend->normalizedcoords[i] / 65536.0 ));
      if ( !( tupleIndex & GX_TI_INTERMEDIATE_TUPLE ) )
        FT_TRACE6(( "      intermediate coordinates %d (%.5f, %.5f):\n",
                    i,
                    im_start_coords[i] / 65536.0,
                    im_end_coords[i] / 65536.0 ));

      /* It's not clear why (for intermediate tuples) we don't need     */
      /* to check against start/end -- the documentation says we don't. */
      /* Similarly, it's unclear why we don't need to scale along the   */
      /* axis.                                                          */

      if ( tuple_coords[i] == 0 )
      {
        FT_TRACE6(( "      tuple coordinate is zero, ignored\n", i ));
        continue;
      }

      if ( blend->normalizedcoords[i] == 0 )
      {
        FT_TRACE6(( "      axis coordinate is zero, stop\n" ));
        apply = 0;
        break;
      }

      if ( blend->normalizedcoords[i] == tuple_coords[i] )
      {
        FT_TRACE6(( "      tuple coordinate value %.5f fits perfectly\n",
                    tuple_coords[i] / 65536.0 ));
        /* `apply' does not change */
        continue;
      }

      if ( !( tupleIndex & GX_TI_INTERMEDIATE_TUPLE ) )
      {
        /* not an intermediate tuple */

        if ( blend->normalizedcoords[i] < FT_MIN( 0, tuple_coords[i] ) ||
             blend->normalizedcoords[i] > FT_MAX( 0, tuple_coords[i] ) )
        {
          FT_TRACE6(( "      tuple coordinate value %.5f is exceeded, stop\n",
                      tuple_coords[i] / 65536.0 ));
          apply = 0;
          break;
        }

        FT_TRACE6(( "      tuple coordinate value %.5f fits\n",
                    tuple_coords[i] / 65536.0 ));
        apply = FT_MulDiv( apply,
                           blend->normalizedcoords[i],
                           tuple_coords[i] );
      }
      else
      {
        /* intermediate tuple */

        if ( blend->normalizedcoords[i] < im_start_coords[i] ||
             blend->normalizedcoords[i] > im_end_coords[i]   )
        {
          FT_TRACE6(( "      intermediate tuple range [%.5f;%.5f] is exceeded,"
                      " stop\n",
                      im_start_coords[i] / 65536.0,
                      im_end_coords[i] / 65536.0 ));
          apply = 0;
          break;
        }

        else if ( blend->normalizedcoords[i] < tuple_coords[i] )
        {
          FT_TRACE6(( "      intermediate tuple range [%.5f;%.5f] fits\n",
                      im_start_coords[i] / 65536.0,
                      im_end_coords[i] / 65536.0 ));
          apply = FT_MulDiv( apply,
                             blend->normalizedcoords[i] - im_start_coords[i],
                             tuple_coords[i] - im_start_coords[i] );
        }

        else
        {
          FT_TRACE6(( "      intermediate tuple range [%.5f;%.5f] fits\n",
                      im_start_coords[i] / 65536.0,
                      im_end_coords[i] / 65536.0 ));
          apply = FT_MulDiv( apply,
                             im_end_coords[i] - blend->normalizedcoords[i],
                             im_end_coords[i] - tuple_coords[i] );
        }
      }
    }

    FT_TRACE6(( "    apply factor is %.5f\n", apply / 65536.0 ));

    return apply;
  }